

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O0

bool DiffTest<Blob<128>,unsigned_int>(pfHash hash,int diffbits,int reps,bool dumpCollisions)

{
  bool bVar1;
  uint in_EDX;
  uint in_ESI;
  code *in_RDI;
  double dVar2;
  double dVar3;
  bool result;
  int i;
  uint h2;
  uint h1;
  Blob<128> k2;
  Blob<128> k1;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> diffs;
  Rand r;
  double expected;
  double testcount;
  double diffcount;
  int hashbits;
  int keybits;
  uint32_t in_stack_ffffffffffffff3c;
  Rand *in_stack_ffffffffffffff40;
  undefined2 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  void *blob;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  byte bVar4;
  int local_98;
  int in_stack_ffffffffffffff6c;
  uint *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_ffffffffffffff80;
  Blob<128> *in_stack_ffffffffffffff88;
  pfHash in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffa0;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_ffffffffffffffa8;
  
  dVar2 = chooseUpToK((int)((ulong)in_stack_ffffffffffffff40 >> 0x20),(int)in_stack_ffffffffffffff40
                     );
  blob = (void *)(dVar2 * (double)(int)in_EDX);
  dVar3 = pow(2.0,32.0);
  dVar3 = (double)blob / dVar3;
  Rand::Rand(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::vector
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)0x12d9fe);
  Blob<128>::Blob((Blob<128> *)&stack0xffffffffffffff90);
  Blob<128>::Blob((Blob<128> *)&stack0xffffffffffffff74);
  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",dVar2,
         (ulong)in_ESI,0x80,0x20);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",
         (void *)(dVar2 * (double)(int)in_EDX),dVar3,(ulong)in_EDX);
  for (local_98 = 0; local_98 < (int)in_EDX; local_98 = local_98 + 1) {
    in_stack_ffffffffffffff54 = local_98;
    if (local_98 % ((int)in_EDX / 10) == 0) {
      printf(".");
    }
    Rand::rand_p((Rand *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),blob,
                 in_stack_ffffffffffffff54);
    Blob<128>::operator=
              ((Blob<128> *)&stack0xffffffffffffff74,(Blob<128> *)&stack0xffffffffffffff90);
    (*in_RDI)(&stack0xffffffffffffff90,0x10,0,&stack0xffffffffffffff70);
    DiffTestRecurse<Blob<128>,unsigned_int>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               (Blob<128> *)in_stack_ffffffffffffff80,
               (uint *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffffa8);
  }
  printf("\n");
  bVar4 = 1;
  bVar1 = ProcessDifferentials<Blob<128>>
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                     SUB41(in_stack_ffffffffffffff78,3));
  bVar4 = (bVar4 & 1 & bVar1) != 0;
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::~vector
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)
             CONCAT44(in_stack_ffffffffffffff54,
                      CONCAT13(bVar1,CONCAT12(bVar4,in_stack_ffffffffffffff50))));
  return (bool)(bVar4 & 1);
}

Assistant:

bool DiffTest ( pfHash hash, int diffbits, int reps, bool dumpCollisions )
{
  const int keybits = sizeof(keytype) * 8;
  const int hashbits = sizeof(hashtype) * 8;

  double diffcount = chooseUpToK(keybits,diffbits);
  double testcount = (diffcount * double(reps));
  double expected  = testcount / pow(2.0,double(hashbits));

  Rand r(100);

  std::vector<keytype> diffs;

  keytype k1,k2;
  hashtype h1,h2;

  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",
         diffcount,diffbits,keybits,hashbits);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",
         reps,testcount,expected);

  for(int i = 0; i < reps; i++)
  {
    if(i % (reps/10) == 0) printf(".");

    r.rand_p(&k1,sizeof(keytype));
    k2 = k1;

    hash(&k1,sizeof(k1),0,(uint32_t*)&h1);

    DiffTestRecurse<keytype,hashtype>(hash,k1,k2,h1,h2,0,diffbits,diffs);
  }
  printf("\n");

  bool result = true;

  result &= ProcessDifferentials(diffs,reps,dumpCollisions);

  return result;
}